

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  char *pcVar1;
  byte bVar2;
  Btree *pBtree;
  MemPage *pPage;
  u8 uVar3;
  Pgno parent;
  Pgno PVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  BtShared *pBVar9;
  u8 *puVar10;
  long lVar11;
  undefined8 uVar12;
  KeyInfo *pKVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  void *pvVar17;
  u64 v;
  ulong uVar18;
  u8 *__dest;
  uchar *pCell;
  u8 uVar19;
  uint uVar20;
  int loc;
  int rc;
  UnpackedRecord r;
  size_t local_b8;
  uint local_ac;
  int local_a8;
  Pgno local_a4;
  KeyInfo *local_a0;
  u8 *local_98;
  BtreePayload *local_90;
  BtCursor *local_88;
  uint local_7c;
  uint *local_78;
  BtShared *local_70;
  Btree *local_68;
  BtreePayload local_60;
  
  pBtree = pCur->pBtree;
  local_a8 = seekResult;
  if ((pCur->curFlags & 0x20) != 0) {
    iVar7 = saveAllCursors(pBtree->pBt,pCur->pgnoRoot,pCur);
    if (iVar7 != 0) {
      return iVar7;
    }
    local_ac = 0;
    if ((seekResult != 0) && (pCur->iPage < '\0')) {
      uVar12 = 0x13803;
      goto LAB_0014708a;
    }
  }
  if ((2 < pCur->eState) && (uVar6 = moveToRoot(pCur), (uVar6 & 0xffffffef) != 0)) {
    return uVar6;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    if (pBtree->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    }
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar7 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&local_a8);
        if (iVar7 != 0) {
          return iVar7;
        }
        local_ac = 0;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar7 = btreeOverwriteCell(pCur,pX);
      return iVar7;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar7 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&local_a8);
      }
      else {
        local_60.nKey = (sqlite3_int64)pX->aMem;
        local_60.aMem._6_1_ = 0;
        local_60._34_1_ = 0;
        local_60.pKey = pCur->pKeyInfo;
        local_60.aMem._4_2_ = pX->nMem;
        iVar7 = sqlite3BtreeIndexMoveto(pCur,(UnpackedRecord *)&local_60,&local_a8);
      }
      if (iVar7 != 0) {
        return iVar7;
      }
      local_ac = 0;
      seekResult = local_a8;
    }
    if (seekResult == 0) {
      getCellInfo(pCur);
      lVar11 = (pCur->info).nKey;
      if (lVar11 == pX->nKey) {
        local_60.pData = pX->pKey;
        local_60.nData = (int)lVar11;
        local_60.nZero = 0;
        iVar7 = btreeOverwriteCell(pCur,&local_60);
        return iVar7;
      }
    }
  }
  pPage = pCur->pPage;
  if (pPage->nFree < 0) {
    if (1 < pCur->eState) {
      uVar12 = 0x1387e;
      goto LAB_0014708a;
    }
    iVar7 = btreeComputeFreeSpace(pPage);
    if (iVar7 != 0) {
      return iVar7;
    }
    local_ac = 0;
  }
  pBVar9 = pBtree->pBt;
  puVar10 = pBVar9->pTmpSpace;
  local_98 = puVar10;
  local_68 = pBtree;
  if ((char)(byte)flags < '\0') {
    local_ac = 0;
    local_b8 = (size_t)(uint)pBVar9->nPreformatSize;
    if (pBVar9->nPreformatSize < 4) {
      puVar10[3] = '\0';
      pBVar9 = pBtree->pBt;
      local_b8 = 4;
    }
    if ((pBVar9->autoVacuum != '\0') && ((uint)pPage->maxLocal < (uint)local_b8)) {
      (*pPage->xParseCell)(pPage,puVar10,(CellInfo *)&local_60);
      if ((uint)local_60.pData != local_60.pData._4_2_) {
        uVar6 = *(uint *)(puVar10 + (local_b8 - 4));
        ptrmapPut(local_68->pBt,
                  uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18,
                  '\x03',pPage->pgno,(int *)&local_ac);
        if (local_ac != 0) {
          return local_ac;
        }
      }
    }
  }
  else {
    bVar2 = pPage->childPtrSize;
    local_90 = pX;
    if (pPage->intKey == '\0') {
      pvVar17 = pX->pKey;
      uVar16 = pX->nKey;
      if ((uint)uVar16 < 0x80) {
        puVar10[bVar2] = (u8)uVar16;
        uVar6 = 1;
      }
      else {
        uVar6 = sqlite3PutVarint(puVar10 + bVar2,(long)(int)(uint)uVar16);
        uVar6 = uVar6 & 0xff;
      }
      iVar7 = uVar6 + bVar2;
      v = uVar16 & 0xffffffff;
      puVar10 = local_98;
    }
    else {
      uVar16 = (ulong)pX->nData;
      v = (long)pX->nZero + uVar16;
      pvVar17 = pX->pData;
      if ((uint)v < 0x80) {
        puVar10[bVar2] = (u8)v;
        uVar6 = 1;
      }
      else {
        uVar6 = sqlite3PutVarint(puVar10 + bVar2,v);
        uVar6 = uVar6 & 0xff;
      }
      uVar6 = uVar6 + bVar2;
      iVar7 = sqlite3PutVarint(puVar10 + uVar6,local_90->nKey);
      iVar7 = iVar7 + uVar6;
    }
    __dest = puVar10 + iVar7;
    iVar8 = (int)v;
    if ((int)(uint)pPage->maxLocal < iVar8) {
      uVar5 = pPage->minLocal;
      local_70 = pPage->pBt;
      local_a0 = (KeyInfo *)0x0;
      uVar6 = (iVar8 - (uint)uVar5) % (local_70->usableSize - 4) + (uint)uVar5;
      if ((int)(uint)pPage->maxLocal < (int)uVar6) {
        uVar6 = (uint)uVar5;
      }
      local_b8 = (size_t)(iVar7 + uVar6 + 4);
      local_78 = (uint *)(puVar10 + (int)(iVar7 + uVar6));
      local_a4 = 0;
      local_88 = pCur;
      while( true ) {
        uVar20 = (uint)v;
        uVar15 = uVar6;
        if ((int)uVar20 < (int)uVar6) {
          uVar15 = uVar20;
        }
        uVar14 = (uint)uVar16;
        if ((int)uVar14 < (int)uVar15) {
          if ((int)uVar14 < 1) {
            memset(__dest,0,(long)(int)uVar15);
          }
          else {
            memcpy(__dest,pvVar17,uVar16 & 0xffffffff);
            uVar15 = uVar14;
          }
        }
        else {
          memcpy(__dest,pvVar17,(long)(int)uVar15);
        }
        pBVar9 = local_70;
        parent = local_a4;
        v = (u64)(uVar20 - uVar15);
        if (uVar20 - uVar15 == 0 || (int)uVar20 < (int)uVar15) break;
        __dest = __dest + (int)uVar15;
        pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar15);
        uVar16 = (ulong)(uVar14 - uVar15);
        uVar6 = uVar6 - uVar15;
        if (uVar6 == 0) {
          local_60.pKey = (KeyInfo *)0x0;
          if (local_70->autoVacuum != '\0') {
            do {
              uVar15 = local_a4;
              local_a4 = uVar15 + 1;
              uVar6 = 0;
              if (1 < local_a4) {
                iVar7 = (uVar15 - 1) - (uVar15 - 1) % (local_70->usableSize / 5 + 1);
                uVar6 = iVar7 + (uint)(iVar7 + 1U == (uint)sqlite3PendingByte / local_70->pageSize)
                        + 2;
              }
            } while ((local_a4 == uVar6) ||
                    (uVar15 == (uint)sqlite3PendingByte / local_70->pageSize));
            local_a4 = uVar15 + 1;
          }
          uVar6 = allocateBtreePage(local_70,(MemPage **)&local_60,&local_a4,local_a4,'\0');
          PVar4 = local_a4;
          local_7c = uVar6;
          if ((pBVar9->autoVacuum == '\0') || (uVar6 != 0)) {
            pKVar13 = local_a0;
            if (uVar6 != 0) goto LAB_00147324;
          }
          else {
            ptrmapPut(pBVar9,local_a4,'\x04' - (parent == 0),parent,(int *)&local_7c);
            uVar6 = local_7c;
            pKVar13 = local_a0;
            if (local_7c != 0) {
              if ((KeyInfo *)local_60.pKey != (KeyInfo *)0x0) {
                sqlite3PagerUnrefNotNull
                          ((DbPage *)((KeyInfo *)((long)local_60.pKey + 0x50))->aColl[0]);
              }
LAB_00147324:
              if (pKVar13 == (KeyInfo *)0x0) {
                return uVar6;
              }
              sqlite3PagerUnrefNotNull((DbPage *)pKVar13[2].aColl[0]);
              return uVar6;
            }
          }
          *local_78 = PVar4 >> 0x18 | (PVar4 & 0xff0000) >> 8 | (PVar4 & 0xff00) << 8 |
                      PVar4 << 0x18;
          if (local_a0 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_a0[2].aColl[0]);
          }
          local_a0 = (KeyInfo *)local_60.pKey;
          local_78 = *(uint **)((long)local_60.pKey + 0x50);
          *local_78 = 0;
          __dest = (u8 *)(*(long *)((long)local_60.pKey + 0x50) + 4);
          uVar6 = local_70->usableSize - 4;
        }
      }
      pCur = local_88;
      pX = local_90;
      if (local_a0 != (KeyInfo *)0x0) {
        sqlite3PagerUnrefNotNull((DbPage *)local_a0[2].aColl[0]);
        pCur = local_88;
        pX = local_90;
      }
    }
    else {
      local_b8 = (size_t)(uint)(iVar7 + iVar8);
      if (iVar7 + iVar8 < 4) {
        __dest[iVar8] = '\0';
        local_b8 = 4;
      }
      iVar7 = (int)uVar16;
      memcpy(__dest,pvVar17,(long)iVar7);
      memset(__dest + iVar7,0,(long)(iVar8 - iVar7));
      pX = local_90;
    }
  }
  uVar5 = pCur->ix;
  uVar16 = (ulong)uVar5;
  (pCur->info).nSize = 0;
  if (local_a8 == 0) {
    if (pPage->nCell <= uVar5) {
      uVar12 = 0x138a8;
LAB_0014708a:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                  "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
      return 0xb;
    }
    iVar7 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar7 != 0) {
      return iVar7;
    }
    pCell = pPage->aData +
            (CONCAT11(pPage->aCellIdx[uVar16 * 2],pPage->aCellIdx[uVar16 * 2 + 1]) & pPage->maskPage
            );
    if (pPage->leaf == '\0') {
      *(undefined4 *)local_98 = *(undefined4 *)pCell;
    }
    (*pPage->xParseCell)(pPage,pCell,(CellInfo *)&local_60);
    uVar6 = 0;
    if ((uint)local_60.pData != local_60.pData._4_2_) {
      uVar6 = clearCellOverflow(pPage,pCell,(CellInfo *)&local_60);
    }
    pCur->curFlags = pCur->curFlags & 0xfb;
    local_ac = uVar6;
    if ((uint)local_b8 == local_60.pData._6_2_) {
      if (((uint)local_60.pData == local_60.pData._4_2_) &&
         ((local_68->pBt->autoVacuum == '\0' || ((uint)local_b8 < pPage->minLocal)))) {
        if (pCell < pPage->aData + (ulong)pPage->hdrOffset + 10) {
          uVar12 = 0x138c3;
        }
        else {
          if (pCell + local_b8 <= pPage->aDataEnd) {
            memcpy(pCell,local_98,local_b8);
            return 0;
          }
          uVar12 = 0x138c6;
        }
        goto LAB_0014708a;
      }
    }
    dropCell(pPage,(uint)uVar5,(uint)local_60.pData._6_2_,(int *)&local_ac);
    if (local_ac != 0) {
      return local_ac;
    }
  }
  else if ((local_a8 < 0) && (pPage->nCell != 0)) {
    pCur->ix = uVar5 + 1;
    uVar16 = (ulong)(ushort)(uVar5 + 1);
    pCur->curFlags = pCur->curFlags & 0xf9;
  }
  uVar6 = (uint)local_b8 + 2;
  if (pPage->nFree < (int)uVar6) {
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = local_98;
    pPage->aiOvfl[bVar2] = (u16)uVar16;
  }
  else {
    iVar7 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar7 != 0) goto LAB_00146fe6;
    pKVar13 = (KeyInfo *)pPage->aData;
    uVar18 = (ulong)pPage->hdrOffset;
    local_60.pKey = (void *)((ulong)local_60.pKey & 0xffffffff00000000);
    uVar15 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
    uVar5 = *(ushort *)((long)pKVar13->aColl + (uVar18 - 0x1b));
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    uVar20 = (uint)uVar5;
    local_90 = pX;
    local_88 = pCur;
    if (uVar5 < uVar15) {
      uVar12 = 0x11ac3;
      if ((uVar20 != 0) || (uVar20 = 0x10000, pPage->pBt->usableSize != 0x10000)) {
LAB_00146fad:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
        pCur = local_88;
        pX = local_90;
        iVar7 = 0xb;
        goto LAB_00146fe6;
      }
    }
    else {
      uVar12 = 0x11ac6;
      if ((int)pPage->pBt->usableSize < (int)uVar20) goto LAB_00146fad;
    }
    if (((*(char *)((long)pKVar13->aColl + (uVar18 - 0x1e)) == '\0') &&
        (*(char *)((long)pKVar13->aColl + (uVar18 - 0x1f)) == '\0')) || (uVar20 < uVar15 + 2)) {
LAB_0014716a:
      if ((int)uVar20 < (int)(uVar15 + uVar6)) {
        iVar8 = pPage->nFree - uVar6;
        iVar7 = 4;
        if (iVar8 < 4) {
          iVar7 = iVar8;
        }
        iVar7 = defragmentPage(pPage,iVar7);
        pCur = local_88;
        pX = local_90;
        if (iVar7 != 0) goto LAB_00146fe6;
        uVar20 = (((uint)*(byte *)((long)pKVar13->aColl + (uVar18 - 0x1b)) * 0x100 +
                  (uint)*(byte *)((long)pKVar13->aColl + (uVar18 - 0x1a))) - 1 & 0xffff) + 1;
      }
      iVar7 = uVar20 - (uint)local_b8;
      uVar19 = (u8)iVar7;
      uVar3 = (u8)((uint)iVar7 >> 8);
      *(ushort *)((long)pKVar13->aColl + (uVar18 - 0x1b)) = (ushort)iVar7 << 8 | (ushort)iVar7 >> 8;
    }
    else {
      local_a0 = pKVar13;
      puVar10 = pageFindSlot(pPage,(uint)local_b8,(int *)&local_60);
      pCur = local_88;
      pKVar13 = local_a0;
      if (puVar10 == (u8 *)0x0) {
        pX = local_90;
        iVar7 = (int)local_60.pKey;
        if ((int)local_60.pKey != 0) goto LAB_00146fe6;
        goto LAB_0014716a;
      }
      lVar11 = (long)puVar10 - (long)local_a0;
      iVar7 = (int)lVar11;
      if (iVar7 <= (int)uVar15) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11ad7,
                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
        pX = local_90;
        iVar7 = 0xb;
        goto LAB_00146fe6;
      }
      uVar3 = (u8)((ulong)lVar11 >> 8);
      uVar19 = (u8)lVar11;
    }
    pCur = local_88;
    pPage->nFree = pPage->nFree - (uVar6 & 0xffff);
    memcpy((void *)((long)pKVar13->aColl + (long)iVar7 + -0x20),local_98,(long)(int)(uint)local_b8);
    puVar10 = pPage->aCellIdx + uVar16 * 2;
    memmove(puVar10 + 2,pPage->aCellIdx + uVar16 * 2,(pPage->nCell - uVar16) * 2);
    pX = local_90;
    *puVar10 = uVar3;
    puVar10[1] = uVar19;
    pPage->nCell = pPage->nCell + 1;
    pcVar1 = (char *)((long)pKVar13->aColl + ((ulong)pPage->hdrOffset - 0x1c));
    *pcVar1 = *pcVar1 + '\x01';
    if (*pcVar1 == '\0') {
      pcVar1 = (char *)((long)pKVar13->aColl + ((ulong)pPage->hdrOffset - 0x1d));
      *pcVar1 = *pcVar1 + '\x01';
    }
    if (pPage->pBt->autoVacuum != '\0') {
      local_60.pKey = (void *)((ulong)local_60.pKey & 0xffffffff00000000);
      ptrmapPutOvflPtr(pPage,pPage,local_98,(int *)&local_60);
      iVar7 = (int)local_60.pKey;
      if ((int)local_60.pKey != 0) goto LAB_00146fe6;
    }
  }
  iVar7 = 0;
LAB_00146fe6:
  if (pPage->nOverflow != '\0') {
    pCur->curFlags = pCur->curFlags & 0xf9;
    iVar7 = balance(pCur);
    pCur->pPage->nOverflow = '\0';
    pCur->eState = '\x01';
    if ((iVar7 == 0 & (byte)flags >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur);
      iVar7 = 0;
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        pvVar17 = sqlite3Malloc(pX->nKey);
        pCur->pKey = pvVar17;
        if (pvVar17 == (void *)0x0) {
          iVar7 = 7;
        }
        else {
          memcpy(pvVar17,pX->pKey,pX->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pX->nKey;
    }
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}